

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

TokenType __thiscall wabt::WastParser::Peek(WastParser *this,size_t n)

{
  Location loc;
  bool bVar1;
  TokenType TVar2;
  size_type sVar3;
  char *format;
  reference this_00;
  Token local_140;
  int local_fc;
  char *pcStack_f8;
  int indent;
  char *local_f0;
  size_type local_e8;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_e0;
  Token local_d8;
  string local_98;
  char *local_78;
  char *local_70;
  size_type local_68;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_60;
  undefined1 auStack_58 [8];
  Token cur;
  size_t n_local;
  WastParser *this_local;
  
  cur.field_2.literal_.text.size_ = n;
  do {
    while( true ) {
      while( true ) {
        sVar3 = CircularArray<wabt::Token,_2UL>::size(&this->tokens_);
        if (cur.field_2.literal_.text.size_ < sVar3) {
          this_00 = CircularArray<wabt::Token,_2UL>::at
                              (&this->tokens_,cur.field_2.literal_.text.size_);
          TVar2 = Token::token_type(this_00);
          return TVar2;
        }
        WastLexer::GetToken((Token *)auStack_58,this->lexer_,this);
        TVar2 = Token::token_type((Token *)auStack_58);
        if (TVar2 == LparAnn) break;
        CircularArray<wabt::Token,_2UL>::push_back(&this->tokens_,(value_type *)auStack_58);
      }
      bVar1 = Features::annotations_enabled((Features *)this->options_);
      if (bVar1) break;
      local_78 = (char *)auStack_58;
      local_70 = cur.loc.filename.data_;
      local_68 = cur.loc.filename.size_;
      local_60.offset = (size_t)cur.loc.field_1.field_1.offset;
      Token::to_string_abi_cxx11_(&local_98,(Token *)auStack_58);
      format = (char *)std::__cxx11::string::c_str();
      Error(this,0x2dd647,format);
      std::__cxx11::string::~string((string *)&local_98);
      pcStack_f8 = (char *)auStack_58;
      local_f0 = cur.loc.filename.data_;
      local_e8 = cur.loc.filename.size_;
      local_e0.offset = (size_t)cur.loc.field_1.field_1.offset;
      loc.filename.size_ = (size_type)cur.loc.filename.data_;
      loc.filename.data_ = (char *)auStack_58;
      loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           cur.loc.filename.size_;
      loc.field_1._8_8_ = cur.loc.field_1.field_1.offset;
      Token::Token(&local_d8,loc,First);
      CircularArray<wabt::Token,_2UL>::push_back(&this->tokens_,&local_d8);
    }
    local_fc = 1;
    while (0 < local_fc) {
      WastLexer::GetToken(&local_140,this->lexer_,this);
      cur.field_2.text_.data_ = (char *)local_140.field_2.text_.size_;
      cur.field_2.text_.size_ = local_140.field_2.literal_.text.size_;
      cur.loc.field_1._8_8_ = local_140._32_8_;
      cur._32_8_ = local_140.field_2.text_.data_;
      cur.loc.filename.size_ = (size_type)local_140.loc.field_1.field_1.offset;
      cur.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           local_140.loc.field_1._8_8_;
      auStack_58 = (undefined1  [8])local_140.loc.filename.data_;
      cur.loc.filename.data_ = (char *)local_140.loc.filename.size_;
      TVar2 = Token::token_type((Token *)auStack_58);
      if (TVar2 == Lpar) {
LAB_0023b098:
        local_fc = local_fc + 1;
      }
      else if (TVar2 == Rpar) {
        local_fc = local_fc + -1;
      }
      else if (TVar2 == LparAnn) goto LAB_0023b098;
    }
  } while( true );
}

Assistant:

TokenType WastParser::Peek(size_t n) {
  while (tokens_.size() <= n) {
    Token cur = lexer_->GetToken(this);
    if (cur.token_type() != TokenType::LparAnn) {
      tokens_.push_back(cur);
    } else {
      // Custom annotation. For now, discard until matching Rpar.
      if (!options_->features.annotations_enabled()) {
        Error(cur.loc, "annotations not enabled: %s", cur.to_string().c_str());
        tokens_.push_back(Token(cur.loc, TokenType::Invalid));
        continue;
      }
      int indent = 1;
      while (indent > 0) {
        cur = lexer_->GetToken(this);
        switch (cur.token_type()) {
          case TokenType::Lpar:
          case TokenType::LparAnn:
            indent++;
            break;

          case TokenType::Rpar:
            indent--;
            break;

          default:
            break;
        }
      }
    }
  }
  return tokens_.at(n).token_type();
}